

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# RegexRuntime.cpp
# Opt level: O0

bool __thiscall
UnifiedRegex::MatchGroupInst::Exec
          (MatchGroupInst *this,Matcher *matcher,Char *input,CharCount inputLength,
          CharCount *matchStart,CharCount *inputOffset,CharCount *nextSyncInputOffset,
          uint8 **instPointer,ContStack *contStack,AssertionStack *assertionStack,uint *qcTicks,
          bool firstIteration)

{
  uint uVar1;
  bool bVar2;
  Char CVar3;
  Char CVar4;
  CharCount endOffset;
  Program *pPVar5;
  uint uVar6;
  bool local_ad;
  undefined1 local_a8 [8];
  anon_class_16_2_48e5e701 toCanonical_1;
  uint acth;
  uint tblidx;
  anon_class_8_1_b578bc12 toCanonical;
  bool doesMatch;
  codepoint_t inputCodePoint;
  codepoint_t cStack_78;
  bool hasGroupCodePoint;
  codepoint_t groupCodePoint;
  codepoint_t equivs [4];
  anon_class_8_1_a81546ea getNextCodePoint;
  bool isCodePointList;
  Type TStack_54;
  bool isCaseInsensitiveMatch;
  CharCount groupEndOffset;
  CharCount groupOffset;
  GroupInfo *info;
  CharCount *pCStack_40;
  bool firstIteration_local;
  CharCount *inputOffset_local;
  CharCount *matchStart_local;
  undefined1 auStack_28 [4];
  CharCount inputLength_local;
  Char *input_local;
  Matcher *matcher_local;
  MatchGroupInst *this_local;
  
  info._7_1_ = firstIteration;
  pCStack_40 = inputOffset;
  inputOffset_local = matchStart;
  matchStart_local._4_4_ = inputLength;
  _auStack_28 = (RegexPattern *)input;
  input_local = (Char *)matcher;
  matcher_local = (Matcher *)this;
  _groupEndOffset = Matcher::GroupIdToGroupInfo(matcher,(this->super_GroupMixin).groupId);
  bVar2 = GroupInfo::IsUndefined(_groupEndOffset);
  if ((!bVar2) && (_groupEndOffset->length != 0)) {
    if (matchStart_local._4_4_ - *pCStack_40 < _groupEndOffset->length) {
      bVar2 = Matcher::Fail((Matcher *)input_local,(Char *)_auStack_28,pCStack_40,instPointer,
                            contStack,assertionStack,qcTicks);
      return bVar2;
    }
    TStack_54 = _groupEndOffset->offset;
    endOffset = TStack_54 + _groupEndOffset->length;
    pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->
                       ((WriteBarrierPtr<const_UnifiedRegex::Program> *)(input_local + 8));
    bVar2 = (pPVar5->flags & IgnoreCaseRegexFlag) == NoRegexFlags;
    pPVar5 = Memory::WriteBarrierPtr<const_UnifiedRegex::Program>::operator->
                       ((WriteBarrierPtr<const_UnifiedRegex::Program> *)(input_local + 8));
    if ((bVar2) || ((pPVar5->flags & UnicodeRegexFlag) == NoRegexFlags)) {
      if (bVar2) {
        do {
          Matcher::CompStats((Matcher *)input_local);
          uVar6 = TStack_54 + 1;
          CVar3 = *(Char *)((long)&(_auStack_28->super_FinalizableObject).
                                   super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                           (ulong)TStack_54 * 2);
          uVar1 = *pCStack_40;
          *pCStack_40 = uVar1 + 1;
          TStack_54 = uVar6;
          if (CVar3 != *(Char *)((long)&(_auStack_28->super_FinalizableObject).
                                        super_IRecyclerVisitedObject._vptr_IRecyclerVisitedObject +
                                (ulong)uVar1 * 2)) {
            bVar2 = Matcher::Fail((Matcher *)input_local,(Char *)_auStack_28,pCStack_40,instPointer,
                                  contStack,assertionStack,qcTicks);
            return bVar2;
          }
        } while (uVar6 < endOffset);
      }
      else {
        do {
          Matcher::CompStats((Matcher *)input_local);
          local_a8 = (undefined1  [8])input_local;
          toCanonical_1.matcher = (Matcher *)auStack_28;
          CVar3 = Exec::anon_class_16_2_48e5e701::operator()
                            ((anon_class_16_2_48e5e701 *)local_a8,&stack0xffffffffffffffac);
          CVar4 = Exec::anon_class_16_2_48e5e701::operator()
                            ((anon_class_16_2_48e5e701 *)local_a8,pCStack_40);
          if (CVar3 != CVar4) {
            bVar2 = Matcher::Fail((Matcher *)input_local,(Char *)_auStack_28,pCStack_40,instPointer,
                                  contStack,assertionStack,qcTicks);
            return bVar2;
          }
        } while (TStack_54 < endOffset);
      }
    }
    else {
      equivs._8_8_ = _auStack_28;
      while (bVar2 = Exec::anon_class_8_1_a81546ea::operator()
                               ((anon_class_8_1_a81546ea *)(equivs + 2),&stack0xffffffffffffffac,
                                endOffset,&inputCodePoint), bVar2) {
        Exec::anon_class_8_1_a81546ea::operator()
                  ((anon_class_8_1_a81546ea *)(equivs + 2),pCStack_40,matchStart_local._4_4_,
                   (codepoint_t *)((long)&toCanonical.matcher + 4));
        toCanonical.matcher._3_1_ = 0;
        bVar2 = Js::NumberUtilities::IsInSupplementaryPlane(inputCodePoint);
        if (bVar2) {
          toCanonical_1.input._4_4_ = 0;
          toCanonical_1.input._0_4_ = 0;
          CaseInsensitive::RangeToEquivClass
                    ((uint *)((long)&toCanonical_1.input + 4),inputCodePoint,inputCodePoint,
                     (uint *)&toCanonical_1.input,&stack0xffffffffffffff88);
          local_ad = true;
          if (((toCanonical.matcher._4_4_ != cStack_78) &&
              (local_ad = true, toCanonical.matcher._4_4_ != groupCodePoint)) &&
             (local_ad = true, toCanonical.matcher._4_4_ != equivs[0])) {
            local_ad = toCanonical.matcher._4_4_ == equivs[1];
          }
          toCanonical.matcher._3_1_ = local_ad;
        }
        else {
          _acth = (Matcher *)input_local;
          CVar3 = Exec::anon_class_8_1_b578bc12::operator()
                            ((anon_class_8_1_b578bc12 *)&acth,inputCodePoint);
          CVar4 = Exec::anon_class_8_1_b578bc12::operator()
                            ((anon_class_8_1_b578bc12 *)&acth,toCanonical.matcher._4_4_);
          toCanonical.matcher._3_1_ = CVar3 == CVar4;
        }
        if ((bool)toCanonical.matcher._3_1_ == false) {
          bVar2 = Matcher::Fail((Matcher *)input_local,(Char *)_auStack_28,pCStack_40,instPointer,
                                contStack,assertionStack,qcTicks);
          return bVar2;
        }
      }
    }
  }
  *instPointer = *instPointer + 5;
  return false;
}

Assistant:

inline bool MatchGroupInst::Exec(REGEX_INST_EXEC_PARAMETERS) const
    {
        GroupInfo* const info = matcher.GroupIdToGroupInfo(groupId);
        if (!info->IsUndefined() && info->length > 0)
        {
            if (info->length > inputLength - inputOffset)
            {
                return matcher.Fail(FAIL_PARAMETERS);
            }

            CharCount groupOffset = info->offset;
            const CharCount groupEndOffset = groupOffset + info->length;

            bool isCaseInsensitiveMatch = (matcher.program->flags & IgnoreCaseRegexFlag) != 0;
            bool isCodePointList = (matcher.program->flags & UnicodeRegexFlag) != 0;

            // This is the only place in the runtime machinery we need to convert characters to their equivalence class
            if (isCaseInsensitiveMatch && isCodePointList)
            {
                auto getNextCodePoint = [=](CharCount &offset, CharCount endOffset, codepoint_t &codePoint) {
                    if (endOffset <= offset)
                    {
                        return false;
                    }

                    Char lowerPart = input[offset];
                    if (!Js::NumberUtilities::IsSurrogateLowerPart(lowerPart) || offset + 1 == endOffset)
                    {
                        codePoint = lowerPart;
                        offset += 1;
                        return true;
                    }

                    Char upperPart = input[offset + 1];
                    if (!Js::NumberUtilities::IsSurrogateUpperPart(upperPart))
                    {
                        codePoint = lowerPart;
                        offset += 1;
                    }
                    else
                    {
                        codePoint = Js::NumberUtilities::SurrogatePairAsCodePoint(lowerPart, upperPart);
                        offset += 2;
                    }

                    return true;
                };

                codepoint_t equivs[CaseInsensitive::EquivClassSize];
                while (true)
                {
                    codepoint_t groupCodePoint;
                    bool hasGroupCodePoint = getNextCodePoint(groupOffset, groupEndOffset, groupCodePoint);
                    if (!hasGroupCodePoint)
                    {
                        break;
                    }

                    // We don't need to verify that there is a valid input code point since at the beginning
                    // of the function, we make sure that the length of the input is at least as long as the
                    // length of the group.
                    codepoint_t inputCodePoint;
                    getNextCodePoint(inputOffset, inputLength, inputCodePoint);

                    bool doesMatch = false;
                    if (!Js::NumberUtilities::IsInSupplementaryPlane(groupCodePoint))
                    {
                        auto toCanonical = [&](codepoint_t c) {
                            return matcher.standardChars->ToCanonical(
                                CaseInsensitive::MappingSource::CaseFolding,
                                static_cast<char16>(c));
                        };
                        doesMatch = (toCanonical(groupCodePoint) == toCanonical(inputCodePoint));
                    }
                    else
                    {
                        uint tblidx = 0;
                        uint acth = 0;
                        CaseInsensitive::RangeToEquivClass(tblidx, groupCodePoint, groupCodePoint, acth, equivs);
                        CompileAssert(CaseInsensitive::EquivClassSize == 4);
                        doesMatch =
                            inputCodePoint == equivs[0]
                            || inputCodePoint == equivs[1]
                            || inputCodePoint == equivs[2]
                            || inputCodePoint == equivs[3];
                    }

                    if (!doesMatch)
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
            }
            else if (isCaseInsensitiveMatch)
            {
                do
                {
#if ENABLE_REGEX_CONFIG_OPTIONS
                    matcher.CompStats();
#endif
                    auto toCanonical = [&](CharCount &offset) {
                        return matcher.standardChars->ToCanonical(CaseInsensitive::MappingSource::UnicodeData, input[offset++]);
                    };

                    if (toCanonical(groupOffset) != toCanonical(inputOffset))
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
                while (groupOffset < groupEndOffset);
            }
            else
            {
                do
                {
#if ENABLE_REGEX_CONFIG_OPTIONS
                    matcher.CompStats();
#endif
                    if (input[groupOffset++] != input[inputOffset++])
                    {
                        return matcher.Fail(FAIL_PARAMETERS);
                    }
                }
                while (groupOffset < groupEndOffset);
            }
        }
        // else: trivially match empty string

        instPointer += sizeof(*this);
        return false;
    }